

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O3

void wr_object_memory(void)

{
  bitflag *pbVar1;
  object_kind *poVar2;
  _Bool _Var3;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  
  wr_u16b(z_info->k_max);
  wr_byte('\x05');
  wr_byte('\x10');
  wr_byte('\x19');
  wr_byte(z_info->brand_max);
  wr_byte(z_info->slay_max);
  wr_byte(z_info->curse_max);
  if (z_info->k_max != 0) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      poVar2 = k_info;
      pbVar1 = k_info->flags;
      bVar4 = (byte)*(undefined4 *)(&k_info->aware + lVar7);
      bVar6 = bVar4 + 2;
      if ((&k_info->tried)[lVar7] == false) {
        bVar6 = bVar4;
      }
      _Var3 = kind_is_ignored_aware((object_kind *)(pbVar1 + lVar7 + -0x80));
      bVar4 = bVar6 + 4;
      if (!_Var3) {
        bVar4 = bVar6;
      }
      bVar6 = bVar4 | 8;
      if ((&poVar2->everseen)[lVar7] == false) {
        bVar6 = bVar4;
      }
      _Var3 = kind_is_ignored_unaware((object_kind *)(pbVar1 + lVar7 + -0x80));
      bVar4 = bVar6 | 0x10;
      if (!_Var3) {
        bVar4 = bVar6;
      }
      wr_byte(bVar4);
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x2a0;
    } while (uVar5 < z_info->k_max);
  }
  return;
}

Assistant:

void wr_object_memory(void)
{
	int k_idx;

	wr_u16b(z_info->k_max);
	wr_byte(OF_SIZE);
	wr_byte(OBJ_MOD_MAX);
	wr_byte(ELEM_MAX);
	wr_byte(z_info->brand_max);
	wr_byte(z_info->slay_max);
	wr_byte(z_info->curse_max);

	/* Kind knowledge */
	for (k_idx = 0; k_idx < z_info->k_max; k_idx++) {
		uint8_t tmp8u = 0;
		struct object_kind *kind = &k_info[k_idx];

		if (kind->aware) tmp8u |= 0x01;
		if (kind->tried) tmp8u |= 0x02;
		if (kind_is_ignored_aware(kind)) tmp8u |= 0x04;
		if (kind->everseen) tmp8u |= 0x08;
		if (kind_is_ignored_unaware(kind)) tmp8u |= 0x10;

		wr_byte(tmp8u);
	}
}